

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  FieldType field_type;
  int number;
  byte bVar1;
  bool packed;
  uint32_t uVar2;
  Descriptor *pDVar3;
  void *pvVar4;
  string_view str;
  string_view str_00;
  string_view str_01;
  LogMessage LStack_38;
  
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    if ((bVar1 & 0x20) == 0) goto LAB_001f6408;
    if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == cpp_type) ||
       ((cpp_type == CPPTYPE_INT32 &&
        (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == CPPTYPE_ENUM)
        ))) {
      if (message_type == (Descriptor *)0x0) {
LAB_001f6397:
        if ((bVar1 & 8) == 0) {
          pvVar4 = MutableRawNonOneofImpl(this,message,field);
          return pvVar4;
        }
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        field_type = field->type_;
        packed = FieldDescriptor::is_packed(field);
        pvVar4 = internal::ExtensionSet::MutableRawRepeatedField
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                            number,field_type,packed,field);
        return pvVar4;
      }
      pDVar3 = FieldDescriptor::message_type(field);
      if (pDVar3 == message_type) {
        bVar1 = field->field_0x1;
        goto LAB_001f6397;
      }
      RepeatedFieldData();
      goto LAB_001f647a;
    }
  }
  else {
    RepeatedFieldData();
LAB_001f6408:
    RepeatedFieldData();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xd6e,
             "field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32)"
            );
  str._M_str = "The type parameter T in RepeatedFieldRef<T> API doesn\'t match ";
  str._M_len = 0x3e;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_38,str);
  str_00._M_str = "the actual field type (for enums T should be the generated enum ";
  str_00._M_len = 0x40;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            (&LStack_38,str_00);
  str_01._M_str = "type or int32_t).";
  str_01._M_len = 0x11;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            (&LStack_38,str_01);
LAB_001f647a:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

void* Reflection::RepeatedFieldData(Message* message,
                                    const FieldDescriptor* field,
                                    FieldDescriptor::CppType cpp_type,
                                    const Descriptor* message_type) const {
  ABSL_CHECK(field->is_repeated());
  ABSL_CHECK(field->cpp_type() == cpp_type ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
              cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32_t).";
  if (message_type != nullptr) {
    ABSL_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}